

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Encode(Underwater_Acoustic_PDU *this,KDataStream *stream)

{
  const_iterator cVar1;
  bool bVar2;
  KDataStream *pKVar3;
  reference DTB;
  reference DTB_00;
  reference DTB_01;
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_48;
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_40;
  const_iterator citrUAES;
  __normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
  local_30;
  const_iterator citrAPA;
  __normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
  local_20;
  const_iterator citrShafts;
  KDataStream *stream_local;
  Underwater_Acoustic_PDU *this_local;
  
  citrShafts._M_current = (Shaft *)stream;
  Header7::Encode(&this->super_Header,stream);
  pKVar3 = DATA_TYPE::operator<<
                     ((KDataStream *)citrShafts._M_current,(DataTypeBase *)&this->m_EmittingEntityID
                     );
  pKVar3 = DATA_TYPE::operator<<(pKVar3,(DataTypeBase *)&this->m_EventID);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8StateUpdateIndicator);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8Padding1);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui16PassiveParamIndex);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8PropPlantConfig);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8NumShafts);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8NumAPA);
  KDataStream::operator<<(pKVar3,this->m_ui8NumEmitterSys);
  local_20._M_current =
       (Shaft *)std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::begin
                          (&this->m_vShafts);
  while( true ) {
    citrAPA._M_current =
         (APA *)std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::end
                          (&this->m_vShafts);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
                        *)&citrAPA);
    cVar1 = citrShafts;
    if (!bVar2) break;
    DTB = __gnu_cxx::
          __normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
          ::operator*(&local_20);
    DATA_TYPE::operator<<((KDataStream *)cVar1._M_current,&DTB->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Shaft_*,_std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>_>
    ::operator++(&local_20);
  }
  local_30._M_current =
       (APA *)std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::begin
                        (&this->m_vAPA);
  while( true ) {
    citrUAES._M_current =
         (UnderwaterAcousticEmitterSystem *)
         std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::end
                   (&this->m_vAPA);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
                        *)&citrUAES);
    cVar1 = citrShafts;
    if (!bVar2) break;
    DTB_00 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
             ::operator*(&local_30);
    DATA_TYPE::operator<<((KDataStream *)cVar1._M_current,&DTB_00->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::APA_*,_std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>_>
    ::operator++(&local_30);
  }
  local_40._M_current =
       (UnderwaterAcousticEmitterSystem *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
       ::begin(&this->m_vUAES);
  while( true ) {
    local_48._M_current =
         (UnderwaterAcousticEmitterSystem *)
         std::
         vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
         ::end(&this->m_vUAES);
    bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
    cVar1 = citrShafts;
    if (!bVar2) break;
    DTB_01 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
             ::operator*(&local_40);
    DATA_TYPE::operator<<((KDataStream *)cVar1._M_current,&DTB_01->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void Underwater_Acoustic_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EmittingEntityID
           << KDIS_STREAM m_EventID
           << m_ui8StateUpdateIndicator
           << m_ui8Padding1
           << m_ui16PassiveParamIndex
           << m_ui8PropPlantConfig
           << m_ui8NumShafts
           << m_ui8NumAPA
           << m_ui8NumEmitterSys;

    vector<Shaft>::const_iterator citrShafts = m_vShafts.begin();

    for( ; citrShafts != m_vShafts.end(); ++citrShafts )
    {
        stream << KDIS_STREAM *citrShafts;
    }

    vector<APA>::const_iterator citrAPA =  m_vAPA.begin();

    for( ; citrAPA != m_vAPA.end(); ++citrAPA )
    {
        stream << KDIS_STREAM *citrAPA;
    }

    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAES = m_vUAES.begin();

    for( ; citrUAES != m_vUAES.end(); ++citrUAES )
    {
        stream << KDIS_STREAM *citrUAES;
    }
}